

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdecompresshelper.cpp
# Opt level: O2

void __thiscall QDecompressHelper::feed(QDecompressHelper *this,QByteDataBuffer *buffer)

{
  QDecompressHelper *pQVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  bool bVar4;
  long in_FS_OFFSET;
  Data *pDVar5;
  QArrayDataPointer<char16_t> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this->totalCompressedBytes = this->totalCompressedBytes + buffer->bufferCompleteSize;
  QByteDataBuffer::append(&this->compressedDataBuffer,buffer);
  bVar4 = countInternal(this,buffer);
  if (!bVar4) {
    if (((this->errorStr).d.size == 0) &&
       (pQVar1 = (this->countHelper)._M_t.
                 super___uniq_ptr_impl<QDecompressHelper,_std::default_delete<QDecompressHelper>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_QDecompressHelper_*,_std::default_delete<QDecompressHelper>_>
                 .super__Head_base<0UL,_QDecompressHelper_*,_false>._M_head_impl,
       pQVar1 != (QDecompressHelper *)0x0)) {
      pDVar5 = (pQVar1->errorStr).d.d;
      pcVar2 = *(char16_t **)((long)&(pQVar1->errorStr).d + 8);
      qVar3 = *(qsizetype *)((long)&(pQVar1->errorStr).d + 0x10);
      if (pDVar5 == (Data *)0x0) {
        local_38.size = 0;
        pDVar5 = (Data *)0x0;
      }
      else {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        local_38.size = (this->errorStr).d.size;
      }
      local_38.d = (this->errorStr).d.d;
      local_38.ptr = (this->errorStr).d.ptr;
      (this->errorStr).d.d = pDVar5;
      (this->errorStr).d.ptr = pcVar2;
      (this->errorStr).d.size = qVar3;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
    }
    clear(this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDecompressHelper::feed(const QByteDataBuffer &buffer)
{
    Q_ASSERT(contentEncoding != None);
    totalCompressedBytes += buffer.byteAmount();
    compressedDataBuffer.append(buffer);
    if (!countInternal(buffer)) {
        if (errorStr.isEmpty() && countHelper)
            errorStr = countHelper->errorString();
        clear(); // If our counting brother failed then so will we :|
    }
}